

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall duckdb::Value::Reinterpret(Value *this,LogicalType *new_type)

{
  LogicalType::operator=(&this->type_,new_type);
  return;
}

Assistant:

void Value::Reinterpret(LogicalType new_type) {
	this->type_ = std::move(new_type);
}